

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.h
# Opt level: O3

bool google::protobuf::compiler::csharp::IsDescriptorOptionMessage(Descriptor *descriptor)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  string name;
  long *local_30 [2];
  long local_20 [2];
  
  iVar2 = std::__cxx11::string::compare((char *)**(undefined8 **)(descriptor + 0x10));
  if (iVar2 == 0) {
    lVar1 = **(long **)(descriptor + 8);
    local_30[0] = local_20;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_30,lVar1,(*(long **)(descriptor + 8))[1] + lVar1);
    iVar2 = std::__cxx11::string::compare((char *)local_30);
    bVar3 = true;
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)local_30);
      if (iVar2 != 0) {
        iVar2 = std::__cxx11::string::compare((char *)local_30);
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare((char *)local_30);
          if (iVar2 != 0) {
            iVar2 = std::__cxx11::string::compare((char *)local_30);
            if (iVar2 != 0) {
              iVar2 = std::__cxx11::string::compare((char *)local_30);
              if (iVar2 != 0) {
                iVar2 = std::__cxx11::string::compare((char *)local_30);
                if (iVar2 != 0) {
                  iVar2 = std::__cxx11::string::compare((char *)local_30);
                  bVar3 = iVar2 == 0;
                }
              }
            }
          }
        }
      }
    }
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

inline bool IsDescriptorOptionMessage(const Descriptor* descriptor) {
  if (!IsDescriptorProto(descriptor->file())) {
    return false;
  }
  const string name = descriptor->full_name();
  return name == "google.protobuf.FileOptions" ||
      name == "google.protobuf.MessageOptions" ||
      name == "google.protobuf.FieldOptions" ||
      name == "google.protobuf.OneofOptions" ||
      name == "google.protobuf.EnumOptions" ||
      name == "google.protobuf.EnumValueOptions" ||
      name == "google.protobuf.ServiceOptions" ||
      name == "google.protobuf.MethodOptions";
}